

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_test.cc
# Opt level: O3

bool MaybeCopyCipherContext(bool copy,UniquePtr<EVP_CIPHER_CTX> *ctx)

{
  _Head_base<0UL,_evp_cipher_ctx_st_*,_false> __p;
  int iVar1;
  bool bVar2;
  undefined7 in_register_00000039;
  UniquePtr<EVP_CIPHER_CTX> ctx2;
  _Head_base<0UL,_evp_cipher_ctx_st_*,_false> local_18;
  
  if ((int)CONCAT71(in_register_00000039,copy) != 0) {
    local_18._M_head_impl = (evp_cipher_ctx_st *)EVP_CIPHER_CTX_new();
    if (((EVP_CIPHER_CTX *)local_18._M_head_impl == (EVP_CIPHER_CTX *)0x0) ||
       (iVar1 = EVP_CIPHER_CTX_copy((EVP_CIPHER_CTX *)local_18._M_head_impl,
                                    (EVP_CIPHER_CTX *)
                                    (ctx->_M_t).
                                    super___uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_evp_cipher_ctx_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_evp_cipher_ctx_st_*,_false>._M_head_impl)
       , __p._M_head_impl = local_18._M_head_impl, iVar1 == 0)) {
      bVar2 = false;
    }
    else {
      local_18._M_head_impl = (evp_cipher_ctx_st *)0x0;
      std::__uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<evp_cipher_ctx_st,_bssl::internal::Deleter> *)ctx,__p._M_head_impl
                );
      bVar2 = true;
    }
    std::unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_cipher_ctx_st,_bssl::internal::Deleter> *)&local_18);
    return bVar2;
  }
  return true;
}

Assistant:

static bool MaybeCopyCipherContext(bool copy,
                                   bssl::UniquePtr<EVP_CIPHER_CTX> *ctx) {
  if (!copy) {
    return true;
  }
  bssl::UniquePtr<EVP_CIPHER_CTX> ctx2(EVP_CIPHER_CTX_new());
  if (!ctx2 || !EVP_CIPHER_CTX_copy(ctx2.get(), ctx->get())) {
    return false;
  }
  *ctx = std::move(ctx2);
  return true;
}